

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

void internal_search(Am_Object *cmd,Am_Which_Search_Direction dir)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Slot_Key key;
  Am_List_Item *pAVar3;
  Am_Value_List old_sel_list;
  Am_Assoc as;
  Am_Object sel_widget;
  Am_Object search_widget;
  Am_Object item;
  Am_Value_List slots_to_item;
  Am_Value_List slots_and_values_used;
  Am_Value v;
  Am_Value_List local_a8;
  Am_Assoc local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Value_List local_78;
  Am_Which_Search_Direction local_64;
  Am_Value_List local_60;
  Am_Value local_50;
  Am_Object *local_40;
  Am_Assoc local_38;
  
  local_64 = dir;
  local_40 = cmd;
  Am_Object::Get_Object((Am_Object *)&local_78,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_88,(Am_Slot_Key)&local_78,10);
  Am_Object::~Am_Object((Am_Object *)&local_78);
  pAVar2 = Am_Object::Get(&local_88,0x197,0);
  Am_Object::Am_Object(&local_90,pAVar2);
  pAVar2 = Am_Object::Get(&local_88,Am_SLOTS_TO_ITEMS,0);
  Am_Value_List::Am_Value_List(&local_78,pAVar2);
  local_98.data = (Am_Assoc_Data *)0x0;
  local_80.data = (Am_Object_Data *)0x0;
  local_50.type = 0;
  local_50.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&local_60);
  Am_Value_List::Start(&local_78);
  do {
    bVar1 = Am_Value_List::Last(&local_78);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_90,0x169,0);
      Am_Value_List::Am_Value_List(&local_a8,pAVar2);
      internal_search_using(local_40,local_64,&local_90,&local_a8,&local_60);
      Am_Value_List::~Am_Value_List(&local_a8);
      Am_Value_List::~Am_Value_List(&local_60);
      Am_Value::~Am_Value(&local_50);
      Am_Object::~Am_Object(&local_80);
      Am_Assoc::~Am_Assoc(&local_98);
      Am_Value_List::~Am_Value_List(&local_78);
      Am_Object::~Am_Object(&local_90);
      Am_Object::~Am_Object(&local_88);
      return;
    }
    pAVar2 = Am_Value_List::Get(&local_78);
    Am_Assoc::operator=(&local_98,pAVar2);
    if (local_98.data == (Am_Assoc_Data *)0x0) {
      Am_Error("Accessing (nullptr) Assoc");
    }
    Am_Value::Am_Value((Am_Value *)&local_a8,&(local_98.data)->value_2);
    Am_Object::operator=(&local_80,(Am_Value *)&local_a8);
    Am_Value::~Am_Value((Am_Value *)&local_a8);
    key = (Am_Slot_Key)&local_80;
    Am_Object::Get_Object((Am_Object *)&local_a8,key,(ulong)Am_USE_ITEM);
    pAVar2 = Am_Object::Get((Am_Object *)&local_a8,0x169,0);
    bVar1 = Am_Value::Valid(pAVar2);
    Am_Object::~Am_Object((Am_Object *)&local_a8);
    if (bVar1) {
      if (local_98.data == (Am_Assoc_Data *)0x0) {
        Am_Error("Accessing (nullptr) Assoc");
      }
      Am_Value::Am_Value((Am_Value *)&local_a8,&(local_98.data)->value_1);
      if ((2 < (ushort)local_a8.data - 1) && ((ushort)local_a8.data != 0x4015)) {
        Am_Error();
      }
      pAVar3 = (Am_List_Item *)((ulong)local_a8.item & 0xffff);
      Am_Value::~Am_Value((Am_Value *)&local_a8);
      if (pAVar3 == (Am_List_Item *)0xb) {
        Am_Object::Get_Object((Am_Object *)&local_a8,key,(ulong)Am_ITEM_VALUE);
        pAVar2 = Am_Object::Get((Am_Object *)&local_a8,0x169,0);
        Am_Value::operator=(&local_50,pAVar2);
      }
      else {
        Am_Object::Get_Object((Am_Object *)&local_a8,key,(ulong)Am_ITEM_VALUE);
        pAVar2 = Am_Object::Get((Am_Object *)&local_a8,0xfa,0);
        Am_Value::operator=(&local_50,pAVar2);
      }
      Am_Object::~Am_Object((Am_Object *)&local_a8);
      local_a8.data._0_2_ = 0x4015;
      local_a8.item = pAVar3;
      Am_Assoc::Am_Assoc(&local_38,(Am_Value *)&local_a8,&local_50);
      value = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_38);
      Am_Value_List::Add(&local_60,value,Am_TAIL,true);
      Am_Assoc::~Am_Assoc(&local_38);
      Am_Value::~Am_Value((Am_Value *)&local_a8);
    }
    Am_Value_List::Next(&local_78);
  } while( true );
}

Assistant:

void
internal_search(Am_Object &cmd, Am_Which_Search_Direction dir)
{
  Am_Object search_widget = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List slots_to_item = search_widget.Get(Am_SLOTS_TO_ITEMS);

  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Object item;
  Am_Value v;
  Am_Value_List slots_and_values_used;
  for (slots_to_item.Start(); !slots_to_item.Last(); slots_to_item.Next()) {
    as = slots_to_item.Get();
    item = as.Value_2();
    if (item.Get_Object(Am_USE_ITEM).Get(Am_VALUE).Valid()) {
      key = as.Value_1();
      if ((Am_Slot_Key)key == Am_PROTOTYPE)
        v = item.Get_Object(Am_ITEM_VALUE).Get(Am_VALUE);
      else
        v = item.Get_Object(Am_ITEM_VALUE).Get(Am_VALUES);
      slots_and_values_used.Add(Am_Assoc(key, v));
    }
  }
  Am_Value_List old_sel_list = sel_widget.Get(Am_VALUE);
  internal_search_using(cmd, dir, sel_widget, old_sel_list,
                        slots_and_values_used);
}